

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportedFileChecksCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  ostream *poVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  string targetName;
  string local_70;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)&this->Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_70,target);
  std::__cxx11::string::append(local_50);
  std::__cxx11::string::~string((string *)&local_70);
  poVar1 = std::operator<<(os,"list(APPEND _IMPORT_CHECK_TARGETS ");
  poVar1 = std::operator<<(poVar1,local_50);
  poVar1 = std::operator<<(poVar1," )\nlist(APPEND _IMPORT_CHECK_FILES_FOR_");
  poVar1 = std::operator<<(poVar1,local_50);
  std::operator<<(poVar1," ");
  for (p_Var3 = (importedLocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(importedLocations->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&properties->_M_t,(key_type *)(p_Var3 + 1));
    if ((_Rb_tree_header *)cVar2._M_node != &(properties->_M_t)._M_impl.super__Rb_tree_header) {
      cmExportFileGeneratorEscape(&local_70,(string *)(cVar2._M_node + 2));
      poVar1 = std::operator<<(os,(string *)&local_70);
      std::operator<<(poVar1," ");
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  std::operator<<(os,")\n\n");
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportedFileChecksCode(
  std::ostream& os, cmGeneratorTarget* target,
  ImportPropertyMap const& properties,
  const std::set<std::string>& importedLocations)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;
  targetName += target->GetExportName();

  os << "list(APPEND _IMPORT_CHECK_TARGETS " << targetName
     << " )\n"
        "list(APPEND _IMPORT_CHECK_FILES_FOR_"
     << targetName << " ";

  for (std::string const& li : importedLocations) {
    ImportPropertyMap::const_iterator pi = properties.find(li);
    if (pi != properties.end()) {
      os << cmExportFileGeneratorEscape(pi->second) << " ";
    }
  }

  os << ")\n\n";
}